

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O3

void __thiscall
async_simple::coro::detail::LazyPromise<void>::unhandled_exception(LazyPromise<void> *this)

{
  void *pvVar1;
  void *__tmp;
  void *local_20;
  
  std::current_exception();
  pvVar1 = (this->_exception)._M_exception_object;
  (this->_exception)._M_exception_object = local_20;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

void unhandled_exception() noexcept {
        _exception = std::current_exception();
    }